

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool __thiscall GdlSetAttrItem::IsMarkedKeySlot(GdlSetAttrItem *this)

{
  bool bVar1;
  size_type_conflict sVar2;
  long in_RDI;
  GdlAttrValueSpec *in_stack_00000010;
  uint iavs;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                      ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                       (in_RDI + 0x78));
    if (sVar2 <= local_14) {
      return false;
    }
    std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
              ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)(in_RDI + 0x78),
               (ulong)local_14);
    bVar1 = GdlAttrValueSpec::IsKeySlotAttr(in_stack_00000010);
    if (bVar1) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

bool GdlSetAttrItem::IsMarkedKeySlot()
{
	for (unsigned int iavs = 0; iavs < m_vpavs.size(); iavs++)
	{
		if (m_vpavs[iavs]->IsKeySlotAttr())
			return true;
	}
	return false;
}